

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall kratos::ForStmt::set_parent(ForStmt *this,IRNode *node)

{
  element_type *peVar1;
  pointer psVar2;
  element_type *peVar3;
  element_type *peVar4;
  Generator *pGVar5;
  UserException *this_00;
  pointer psVar6;
  pointer psVar7;
  pointer psVar8;
  long lVar9;
  ulong uVar10;
  Generator *gen;
  string local_40;
  
  if (node->ast_node_type_ == StmtKind) {
    pGVar5 = Stmt::generator_parent((Stmt *)node);
    if (pGVar5 != (Generator *)0x0) {
      (((this->iter_).super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_Var).generator_ = pGVar5;
    }
    (this->super_Stmt).parent_ = node;
    peVar1 = (this->loop_body_).
             super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar2 = (peVar1->super_StmtBlock).stmts_.
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar7 = (peVar1->super_StmtBlock).stmts_.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar2; psVar7 = psVar7 + 1)
    {
      peVar3 = (psVar7->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar3->super_IRNode)._vptr_IRNode[7])(peVar3,this);
    }
    return;
  }
  peVar1 = (this->loop_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar7 = (peVar1->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (peVar1->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar10 = (long)psVar2 - (long)psVar7;
  if (0 < (long)uVar10 >> 6) {
    psVar6 = (pointer)((long)&(psVar7->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)
                              ._M_ptr + (uVar10 & 0xffffffffffffffc0));
    lVar9 = ((long)uVar10 >> 6) + 1;
    psVar8 = psVar7 + 2;
    do {
      if ((psVar8[-2].super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_ !=
          ModuleInstantiation) {
        psVar8 = psVar8 + -2;
        goto LAB_001a2c11;
      }
      if ((psVar8[-1].super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_ !=
          ModuleInstantiation) {
        psVar8 = psVar8 + -1;
        goto LAB_001a2c11;
      }
      if (((psVar8->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ !=
          ModuleInstantiation) goto LAB_001a2c11;
      if ((psVar8[1].super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_ !=
          ModuleInstantiation) {
        psVar8 = psVar8 + 1;
        goto LAB_001a2c11;
      }
      lVar9 = lVar9 + -1;
      psVar8 = psVar8 + 4;
    } while (1 < lVar9);
    uVar10 = (long)psVar2 - (long)psVar6;
    psVar7 = psVar6;
  }
  lVar9 = (long)uVar10 >> 4;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      psVar8 = psVar2;
      if ((lVar9 != 3) ||
         (psVar8 = psVar7,
         ((psVar7->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ !=
         ModuleInstantiation)) goto LAB_001a2c11;
      psVar7 = psVar7 + 1;
    }
    psVar8 = psVar7;
    if (((psVar7->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ !=
        ModuleInstantiation) goto LAB_001a2c11;
    psVar7 = psVar7 + 1;
  }
  psVar8 = psVar7;
  if (((psVar7->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ ==
      ModuleInstantiation) {
    psVar8 = psVar2;
  }
LAB_001a2c11:
  if (((node->ast_node_type_ == GeneratorKind) && (psVar8 == psVar2)) &&
     (peVar4 = (this->iter_).super___shared_ptr<kratos::IterVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar4->is_gen_var_ != false)) {
    (peVar4->super_Var).generator_ = (Generator *)node;
    (this->super_Stmt).parent_ = node;
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"For loop can only be added to statement body","");
  UserException::UserException(this_00,&local_40);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ForStmt::set_parent(IRNode *node) {
    if (node->ir_node_kind() != IRNodeKind::StmtKind) {
        // make sure it is genvar and all it's statements is instantiation statement
        bool all_instantiation = std::all_of(
            loop_body_->begin(), loop_body_->end(), [](const std::shared_ptr<Stmt> &stmt) {
                return stmt->type() == StatementType::ModuleInstantiation;
            });
        // make sure it's genvar marked
        bool is_genvar = iter_->is_gen_var();
        if (!is_genvar || !all_instantiation || node->ir_node_kind() != IRNodeKind::GeneratorKind) {
            throw UserException("For loop can only be added to statement body");
        } else {
            auto *gen = reinterpret_cast<Generator *>(node);
            iter_->set_generator(gen);
            Stmt::set_parent(node);
            return;
        }
    }
    auto *stmt = reinterpret_cast<Stmt *>(node);
    auto *gen = stmt->generator_parent();
    if (gen) {
        iter_->set_generator(gen);
    }
    Stmt::set_parent(node);
    for (auto &st : (*loop_body_)) {
        st->set_parent(this);
    }
}